

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 floatx80_to_float128_mipsel(floatx80 a,float_status *status)

{
  commonNaNT a_00;
  ushort uVar1;
  ulong uVar2;
  float128 fVar3;
  floatx80 a_01;
  commonNaNT local_28;
  
  uVar2 = a.low;
  uVar1 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar2)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar3 = float128_default_nan_mipsel(status);
    return fVar3;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      uVar1 != 0x7fff) {
    fVar3.high = (ulong)uVar1 << 0x30 | (a._8_8_ >> 0xf) << 0x3f | uVar2 >> 0xf & 0xffffffffffff;
    fVar3.low = uVar2 << 0x31;
  }
  else {
    a_01._8_8_ = a._8_8_ & 0xffffffff;
    a_01.low = uVar2;
    floatx80ToCommonNaN(&local_28,a_01,status);
    a_00.high = local_28.high;
    a_00.sign = local_28.sign;
    a_00._1_7_ = local_28._1_7_;
    a_00.low = local_28.low;
    fVar3 = commonNaNToFloat128(a_00,status);
  }
  return fVar3;
}

Assistant:

float128 floatx80_to_float128(floatx80 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( ( aExp == 0x7FFF ) && (uint64_t) ( aSig<<1 ) ) {
        return commonNaNToFloat128(floatx80ToCommonNaN(a, status), status);
    }
    shift128Right( aSig<<1, 0, 16, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp, zSig0, zSig1 );

}